

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependencies.cpp
# Opt level: O1

void __thiscall
dg::llvmdg::SDGDependenciesBuilder::processDG(SDGDependenciesBuilder *this,Function *F)

{
  long *plVar1;
  raw_ostream *v;
  undefined8 *puVar2;
  DependenceGraph *pDVar3;
  DGBBlock *block;
  raw_ostream *prVar4;
  DepDGElement *pDVar5;
  Function *pFVar6;
  Instruction *I;
  BasicBlock *__range3;
  Function *b;
  undefined8 *puVar7;
  BasicBlock *pBVar8;
  StringRef Str;
  StringRef Str_00;
  DepDGElement *local_68;
  DepDGElement *local_60;
  undefined8 *local_58;
  undefined8 *puStack_50;
  long local_48;
  Function *local_38;
  
  pDVar3 = SystemDependenceGraph::getDG(this->_sdg,F);
  local_38 = F;
  for (pFVar6 = *(Function **)(F + 0x50); pFVar6 != F + 0x48; pFVar6 = *(Function **)(pFVar6 + 8)) {
    b = pFVar6 + -0x18;
    if (pFVar6 == (Function *)0x0) {
      b = (Function *)0x0;
    }
    for (pBVar8 = *(BasicBlock **)((BasicBlock *)b + 0x30); pBVar8 != (BasicBlock *)b + 0x28;
        pBVar8 = *(BasicBlock **)(pBVar8 + 8)) {
      I = (Instruction *)(pBVar8 + -0x18);
      if (pBVar8 == (BasicBlock *)0x0) {
        I = (Instruction *)0x0;
      }
      processInstr(this,I);
    }
    block = SystemDependenceGraph::getBBlock(this->_sdg,(BasicBlock *)b);
    addControlDependencies(this,block,(BasicBlock *)b);
  }
  local_68 = (DepDGElement *)(pDVar3->_parameters).super_DGParameters._noreturn;
  if (local_68 == (DepDGElement *)0x0) {
    local_68 = (DepDGElement *)dg::sdg::DGParameters::createNoReturn();
  }
  plVar1 = *(long **)(this->CDA + 0x70);
  if (plVar1 == (long *)0x0) {
    local_58 = (undefined8 *)0x0;
    puStack_50 = (undefined8 *)0x0;
    local_48 = 0;
  }
  else {
    (**(code **)(*plVar1 + 0x48))(&local_58,plVar1,local_38);
  }
  puVar2 = puStack_50;
  if (local_58 != puStack_50) {
    puVar7 = local_58;
    do {
      v = (raw_ostream *)*puVar7;
      prVar4 = (raw_ostream *)llvm::errs();
      Str.Length = 7;
      Str.Data = "NORET: ";
      prVar4 = llvm::raw_ostream::operator<<(prVar4,Str);
      llvm::Value::print(v,SUB81(prVar4,0));
      Str_00.Length = 1;
      Str_00.Data = "\n";
      llvm::raw_ostream::operator<<(prVar4,Str_00);
      pDVar5 = (DepDGElement *)SystemDependenceGraph::getNode(this->_sdg,(Value *)v);
      if (*(int *)&pDVar5->field_0xc < 2) {
        pDVar5 = (DepDGElement *)0x0;
      }
      if (pDVar5 != (DepDGElement *)0x0 && *(int *)&pDVar5->field_0xc == 6) {
        pDVar5 = (DepDGElement *)
                 pDVar5[1]._use_deps.super_DGContainer<dg::sdg::DepDGElement_*,_4U>.container._M_t.
                 _M_impl.super__Rb_tree_header._M_node_count;
      }
      local_60 = pDVar5;
      std::
      _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
      ::_M_insert_unique<dg::sdg::DepDGElement*const&>
                ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
                  *)&local_68->_control_deps,&local_60);
      local_60 = local_68;
      std::
      _Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
      ::_M_insert_unique<dg::sdg::DepDGElement*const&>
                ((_Rb_tree<dg::sdg::DepDGElement*,dg::sdg::DepDGElement*,std::_Identity<dg::sdg::DepDGElement*>,std::less<dg::sdg::DepDGElement*>,std::allocator<dg::sdg::DepDGElement*>>
                  *)&pDVar5->_rev_control_deps,&local_60);
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
  }
  if (local_58 != (undefined8 *)0x0) {
    operator_delete(local_58,local_48 - (long)local_58);
  }
  return;
}

Assistant:

void processDG(llvm::Function &F) {
        auto *dg = _sdg.getDG(&F);
        assert(dg && "Do not have dg");

        for (auto &B : F) {
            for (auto &I : B) {
                processInstr(I);
            }

            // block-based control dependencies
            addControlDependencies(_sdg.getBBlock(&B), B);
        }

        // add noreturn dependencies

        DBG(sdg, "Adding noreturn dependencies to " << F.getName().str());
        auto *noret = dg->getParameters().getNoReturn();
        if (!noret)
            noret = &dg->getParameters().createNoReturn();
        for (auto *dep : CDA->getNoReturns(&F)) {
            llvm::errs() << "NORET: " << *dep << "\n";
            auto *nd = sdg::DepDGElement::get(_sdg.getNode(dep));
            assert(nd && "Do not have the node");
            if (auto *C = sdg::DGNodeCall::get(nd)) {
                // if this is call, add it again to noret node
                auto *cnoret = C->getParameters().getNoReturn();
                assert(cnoret && "Did not create a noret for a call");
                noret->addControlDep(*cnoret);
            } else {
                noret->addControlDep(*nd);
            }
        }
    }